

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall
ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
          (basic_ofstream<char,_std::char_traits<char>_> *this)

{
  std::ios_base::ios_base
            ((ios_base *)
             &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  *(code **)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).
             super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       std::__basic_file<char>::is_open;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1d0 = 0;
  *(undefined2 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1d8 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1e0 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1e8 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1f0 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1f8 = 0;
  std::ofstream::ofstream((ofstream *)this);
  (this->super_basic_ofstream<char,_std::char_traits<char>_>).
  super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x1be778;
  *(undefined8 *)
   &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
    super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 = 0x1be7a0;
  return;
}

Assistant:

basic_ofstream() {}